

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O1

void __thiscall Firework::update(Firework *this)

{
  pointer *ppPVar1;
  pointer pPVar2;
  bool bVar3;
  pointer __src;
  Particle *particle;
  pointer pPVar4;
  
  if (this->exploded == false) {
    Particle::update(&this->rocket);
    if (0.0 <= (this->rocket).velocity.field_0.field_0.y) {
      explode(this);
      return;
    }
  }
  else {
    pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pPVar4 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                  super__Vector_impl_data._M_start; pPVar4 != pPVar2; pPVar4 = pPVar4 + 1) {
      (pPVar4->velocity).field_0.field_0.x = (pPVar4->velocity).field_0.field_0.x * 0.95;
      (pPVar4->velocity).field_0.field_0.y = (pPVar4->velocity).field_0.field_0.y * 0.95;
      Particle::update(pPVar4);
    }
    pPVar4 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (pPVar4 != (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                     _M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = Particle::isDead(pPVar4);
      if (bVar3) {
        __src = pPVar4 + 1;
        pPVar2 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (__src != pPVar2) {
          memmove(pPVar4,__src,(long)pPVar2 - (long)__src);
        }
        ppPVar1 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + -1;
      }
      else {
        pPVar4 = pPVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void Firework::update() {
    if (!exploded) {
        rocket.update();
        if (rocket.velocity.y >= 0.0f) {
            explode();
        }
    } else {
        for (Particle& particle : particles) {
            particle.velocity *= 0.95;
            particle.update();
        }
        std::vector<Particle>::iterator it = particles.begin();
        while(it != particles.end()) {
            if ((*it).isDead()) {
                it = particles.erase(it);
            } else {
                it++;
            }
        }
    }
}